

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall TPZManVector<int,_3>::Resize(TPZManVector<int,_3> *this,int64_t newsize,int *object)

{
  int iVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int64_t i;
  ulong uVar10;
  ulong uVar11;
  int iVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  
  auVar5 = _DAT_014d2b10;
  auVar4 = _DAT_014d28c0;
  auVar3 = _DAT_014d28b0;
  if (-1 < newsize) {
    lVar8 = (this->super_TPZVec<int>).fNElements;
    if (newsize != lVar8) {
      lVar7 = (this->super_TPZVec<int>).fNAlloc;
      if (lVar7 < newsize) {
        if ((ulong)newsize < 4) {
          if (lVar8 < 1) {
            lVar8 = 0;
          }
          else {
            piVar6 = (this->super_TPZVec<int>).fStore;
            lVar7 = 0;
            do {
              this->fExtAlloc[lVar7] = piVar6[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar8 != lVar7);
          }
          auVar5 = _DAT_014d2b10;
          auVar4 = _DAT_014d28c0;
          auVar3 = _DAT_014d28b0;
          lVar7 = newsize - lVar8;
          if (lVar7 != 0 && lVar8 <= newsize) {
            iVar1 = *object;
            lVar9 = lVar7 + -1;
            auVar13._8_4_ = (int)lVar9;
            auVar13._0_8_ = lVar9;
            auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
            uVar11 = 0;
            auVar13 = auVar13 ^ _DAT_014d28c0;
            do {
              auVar18._8_4_ = (int)uVar11;
              auVar18._0_8_ = uVar11;
              auVar18._12_4_ = (int)(uVar11 >> 0x20);
              auVar19 = (auVar18 | auVar3) ^ auVar4;
              iVar14 = auVar13._4_4_;
              if ((bool)(~(auVar19._4_4_ == iVar14 && auVar13._0_4_ < auVar19._0_4_ ||
                          iVar14 < auVar19._4_4_) & 1)) {
                this->fExtAlloc[lVar8 + uVar11] = iVar1;
              }
              if ((auVar19._12_4_ != auVar13._12_4_ || auVar19._8_4_ <= auVar13._8_4_) &&
                  auVar19._12_4_ <= auVar13._12_4_) {
                this->fExtAlloc[lVar8 + uVar11 + 1] = iVar1;
              }
              auVar19 = (auVar18 | auVar5) ^ auVar4;
              iVar20 = auVar19._4_4_;
              if (iVar20 <= iVar14 && (iVar20 != iVar14 || auVar19._0_4_ <= auVar13._0_4_)) {
                this->fExtAlloc[lVar8 + uVar11 + 2] = iVar1;
                this->fExtAlloc[lVar8 + uVar11 + 3] = iVar1;
              }
              uVar11 = uVar11 + 4;
            } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar11);
          }
          piVar6 = (this->super_TPZVec<int>).fStore;
          if (piVar6 != (int *)0x0 && piVar6 != this->fExtAlloc) {
            operator_delete__(piVar6);
          }
          (this->super_TPZVec<int>).fStore = this->fExtAlloc;
          (this->super_TPZVec<int>).fNElements = newsize;
          (this->super_TPZVec<int>).fNAlloc = 3;
        }
        else {
          dVar15 = (double)lVar7 * 1.2;
          uVar11 = (long)dVar15;
          if (dVar15 < (double)newsize) {
            uVar11 = newsize;
          }
          piVar6 = (int *)operator_new__(-(ulong)(uVar11 >> 0x3e != 0) | uVar11 * 4);
          lVar7 = 0;
          if (0 < lVar8) {
            piVar2 = (this->super_TPZVec<int>).fStore;
            lVar9 = 0;
            do {
              piVar6[lVar9] = piVar2[lVar9];
              lVar9 = lVar9 + 1;
              lVar7 = lVar8;
            } while (lVar8 != lVar9);
          }
          auVar5 = _DAT_014d2b10;
          auVar4 = _DAT_014d28c0;
          auVar3 = _DAT_014d28b0;
          lVar8 = newsize - lVar7;
          if (lVar8 != 0 && lVar7 <= newsize) {
            iVar1 = *object;
            lVar9 = lVar8 + -1;
            auVar12._8_4_ = (int)lVar9;
            auVar12._0_8_ = lVar9;
            auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
            uVar10 = 0;
            auVar12 = auVar12 ^ _DAT_014d28c0;
            do {
              auVar17._8_4_ = (int)uVar10;
              auVar17._0_8_ = uVar10;
              auVar17._12_4_ = (int)(uVar10 >> 0x20);
              auVar19 = (auVar17 | auVar3) ^ auVar4;
              iVar14 = auVar12._4_4_;
              if ((bool)(~(auVar19._4_4_ == iVar14 && auVar12._0_4_ < auVar19._0_4_ ||
                          iVar14 < auVar19._4_4_) & 1)) {
                piVar6[lVar7 + uVar10] = iVar1;
              }
              if ((auVar19._12_4_ != auVar12._12_4_ || auVar19._8_4_ <= auVar12._8_4_) &&
                  auVar19._12_4_ <= auVar12._12_4_) {
                piVar6[lVar7 + uVar10 + 1] = iVar1;
              }
              auVar19 = (auVar17 | auVar5) ^ auVar4;
              iVar20 = auVar19._4_4_;
              if (iVar20 <= iVar14 && (iVar20 != iVar14 || auVar19._0_4_ <= auVar12._0_4_)) {
                piVar6[lVar7 + uVar10 + 2] = iVar1;
                piVar6[lVar7 + uVar10 + 3] = iVar1;
              }
              uVar10 = uVar10 + 4;
            } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar10);
          }
          piVar2 = (this->super_TPZVec<int>).fStore;
          if (piVar2 != (int *)0x0 && piVar2 != this->fExtAlloc) {
            operator_delete__(piVar2);
          }
          (this->super_TPZVec<int>).fStore = piVar6;
          (this->super_TPZVec<int>).fNElements = newsize;
          (this->super_TPZVec<int>).fNAlloc = uVar11;
        }
      }
      else {
        lVar7 = newsize - lVar8;
        if (lVar7 != 0 && lVar8 <= newsize) {
          piVar6 = (this->super_TPZVec<int>).fStore;
          iVar1 = *object;
          lVar9 = lVar7 + -1;
          auVar19._8_4_ = (int)lVar9;
          auVar19._0_8_ = lVar9;
          auVar19._12_4_ = (int)((ulong)lVar9 >> 0x20);
          uVar11 = 0;
          auVar19 = auVar19 ^ _DAT_014d28c0;
          do {
            auVar16._8_4_ = (int)uVar11;
            auVar16._0_8_ = uVar11;
            auVar16._12_4_ = (int)(uVar11 >> 0x20);
            auVar12 = (auVar16 | auVar3) ^ auVar4;
            iVar14 = auVar19._4_4_;
            if ((bool)(~(auVar12._4_4_ == iVar14 && auVar19._0_4_ < auVar12._0_4_ ||
                        iVar14 < auVar12._4_4_) & 1)) {
              piVar6[lVar8 + uVar11] = iVar1;
            }
            if ((auVar12._12_4_ != auVar19._12_4_ || auVar12._8_4_ <= auVar19._8_4_) &&
                auVar12._12_4_ <= auVar19._12_4_) {
              piVar6[lVar8 + uVar11 + 1] = iVar1;
            }
            auVar16 = (auVar16 | auVar5) ^ auVar4;
            iVar20 = auVar16._4_4_;
            if (iVar20 <= iVar14 && (iVar20 != iVar14 || auVar16._0_4_ <= auVar19._0_4_)) {
              piVar6[lVar8 + uVar11 + 2] = iVar1;
              piVar6[lVar8 + uVar11 + 3] = iVar1;
            }
            uVar11 = uVar11 + 4;
          } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar11);
        }
        (this->super_TPZVec<int>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}